

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadCertificate.h
# Opt level: O2

string * generate_cert(string *__return_storage_ptr__,string *domain_name,string *main_dirpath)

{
  bool bVar1;
  __type_conflict _Var2;
  path *__p;
  allocator<char> local_341;
  string *local_340;
  string path_string;
  string ext_filepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  directory_iterator __end1;
  string crt_dirpath;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_240;
  string command;
  
  local_340 = domain_name;
  std::mutex::lock(&mut);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path_string,"/",(allocator<char> *)&ext_filepath);
  std::operator+(&command,main_dirpath,&path_string);
  std::operator+(&crt_dirpath,&command,"certs");
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::~string((string *)&path_string);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&command,&crt_dirpath,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_2c8,(path *)&command);
  std::filesystem::__cxx11::path::~path((path *)&command);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_258,
             (__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> *)&local_2c8)
  ;
  local_2e8._M_dataplus._M_p = (pointer)local_258._M_ptr;
  local_2e8._M_string_length = (size_type)local_258._M_refcount._M_pi;
  local_258._M_ptr = (element_type *)0x0;
  local_258._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_240,
             (__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> *)&local_2c8)
  ;
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_240._M_refcount);
  do {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._M_string_length ==
        __end1._M_dir._M_refcount._M_pi) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8._M_string_length);
      std::operator+(&ext_filepath,&crt_dirpath,"/");
      std::operator+(&path_string,&ext_filepath,local_340);
      std::filesystem::__cxx11::path::path((path *)&command,&path_string,auto_format);
      std::filesystem::create_directories((path *)&command);
      std::filesystem::__cxx11::path::~path((path *)&command);
      std::__cxx11::string::~string((string *)&path_string);
      std::__cxx11::string::~string((string *)&ext_filepath);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&command,"domains.ext",(allocator<char> *)&path_string);
      build_path(&ext_filepath,&crt_dirpath,local_340,&command);
      std::__cxx11::string::~string((string *)&command);
      std::__cxx11::string::string<std::allocator<char>>((string *)&__end1,"/",&local_341);
      std::operator+(&local_2e8,main_dirpath,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1);
      std::operator+(&local_2c8,&local_2e8,"domains.ext");
      std::filesystem::__cxx11::path::path((path *)&command,&local_2c8,auto_format);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&path_string,&ext_filepath,auto_format);
      std::filesystem::copy((EVP_PKEY_CTX *)&command,(EVP_PKEY_CTX *)&path_string);
      std::filesystem::__cxx11::path::~path((path *)&path_string);
      std::filesystem::__cxx11::path::~path((path *)&command);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&__end1);
      std::ofstream::ofstream(&command,(string *)&ext_filepath,_S_app);
      std::operator+(&path_string,"DNS.1 = ",local_340);
      std::operator<<((ostream *)&command,(string *)&path_string);
      std::__cxx11::string::~string((string *)&path_string);
      std::ofstream::~ofstream(&command);
      build_path_command(&command,&crt_dirpath,local_340,main_dirpath);
      system(command._M_dataplus._M_p);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&path_string,"localhost.crt",(allocator<char> *)&local_2c8);
      build_path(__return_storage_ptr__,&crt_dirpath,local_340,&path_string);
      std::__cxx11::string::~string((string *)&path_string);
      std::__cxx11::string::~string((string *)&command);
      std::__cxx11::string::~string((string *)&ext_filepath);
LAB_0010eaea:
      std::__cxx11::string::~string((string *)&crt_dirpath);
      pthread_mutex_unlock((pthread_mutex_t *)&mut);
      return __return_storage_ptr__;
    }
    __p = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                            ((directory_iterator *)&local_2e8);
    std::filesystem::__cxx11::path::path((path *)&command,__p);
    std::filesystem::__cxx11::path::string(&path_string,(path *)&command);
    std::__cxx11::string::rfind((char *)&path_string,0x14ed8c);
    bVar1 = std::filesystem::is_directory((path *)&command);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&ext_filepath,(ulong)&path_string);
      _Var2 = std::operator==(&ext_filepath,local_340);
      std::__cxx11::string::~string((string *)&ext_filepath);
      if (_Var2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ext_filepath,"localhost.crt",&local_341);
        build_path(__return_storage_ptr__,&crt_dirpath,local_340,&ext_filepath);
        std::__cxx11::string::~string((string *)&ext_filepath);
        std::__cxx11::string::~string((string *)&path_string);
        std::filesystem::__cxx11::path::~path((path *)&command);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8._M_string_length);
        goto LAB_0010eaea;
      }
    }
    std::__cxx11::string::~string((string *)&path_string);
    std::filesystem::__cxx11::path::~path((path *)&command);
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&local_2e8);
  } while( true );
}

Assistant:

std::string generate_cert(const std::string& domain_name,
                            const std::string& main_dirpath) {
    std::lock_guard<std::mutex> m(mut);

    const std::string crt_dirpath = main_dirpath + std::string("/") + CERTS_DIRNAME;

    for(const auto& p : fs::directory_iterator(crt_dirpath)) {
        fs::path path = p.path();
        std::string path_string = path.string();
        size_t pos = path_string.rfind("/");
        if (fs::is_directory(path) && 
                path_string.substr(pos + 1, path_string.length()) == domain_name) {
            return build_path(crt_dirpath, domain_name, CRT_FILENAME);
        }
    }

    fs::create_directories(crt_dirpath + "/" + domain_name);

    std::string ext_filepath = build_path(crt_dirpath, domain_name, EXT_FILENAME);

    fs::copy(main_dirpath + std::string("/") + EXT_FILENAME, ext_filepath); {
        std::ofstream file(ext_filepath, std::ios::app);
        file << "DNS.1 = " + domain_name;
    }
    std::string command = build_path_command(crt_dirpath, domain_name, main_dirpath);

    int _ = std::system(command.c_str());

    return build_path(crt_dirpath, domain_name, CRT_FILENAME);
}